

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx512(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  int i;
  uint uVar5;
  undefined1 (*pauVar6) [64];
  long lVar7;
  undefined1 (*__s) [64];
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  uint32_t out_counters [16];
  __m512i masks [16];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [64];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  __s = &local_980;
  lVar7 = 0;
  memset(__s,0,0x400);
  pauVar6 = &local_480;
  do {
    auVar9 = vpbroadcastw_avx512bw();
    auVar9 = vmovdqa64_avx512f(auVar9);
    *pauVar6 = auVar9;
    lVar7 = lVar7 + 1;
    pauVar6 = pauVar6 + 1;
  } while (lVar7 != 0x10);
  local_9c0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar9 = vmovdqa64_avx512f(local_980);
  if (0x1f < len) {
    local_4c0 = local_480._0_8_;
    uStack_4b8 = local_480._8_8_;
    uStack_4b0 = local_480._16_8_;
    uStack_4a8 = local_480._24_8_;
    uStack_4a0 = local_480._32_8_;
    uStack_498 = local_480._40_8_;
    uStack_490 = local_480._48_8_;
    uStack_488 = local_480._56_8_;
    local_500 = local_440;
    uStack_4f8 = uStack_438;
    uStack_4f0 = uStack_430;
    uStack_4e8 = uStack_428;
    uStack_4e0 = uStack_420;
    uStack_4d8 = uStack_418;
    uStack_4d0 = uStack_410;
    uStack_4c8 = uStack_408;
    local_540 = local_400;
    uStack_538 = uStack_3f8;
    uStack_530 = uStack_3f0;
    uStack_528 = uStack_3e8;
    uStack_520 = uStack_3e0;
    uStack_518 = uStack_3d8;
    uStack_510 = uStack_3d0;
    uStack_508 = uStack_3c8;
    local_580 = local_3c0;
    uStack_578 = uStack_3b8;
    uStack_570 = uStack_3b0;
    uStack_568 = uStack_3a8;
    uStack_560 = uStack_3a0;
    uStack_558 = uStack_398;
    uStack_550 = uStack_390;
    uStack_548 = uStack_388;
    auVar10 = vmovdqa64_avx512f(local_380);
    auVar11 = vmovdqa64_avx512f(local_340);
    auVar12 = vmovdqa64_avx512f(local_300);
    auVar13 = vmovdqa64_avx512f(local_2c0);
    auVar14 = vmovdqa64_avx512f(local_280);
    auVar15 = vmovdqa64_avx512f(local_240);
    auVar16 = vmovdqa64_avx512f(local_200);
    auVar17 = vmovdqa64_avx512f(local_1c0);
    auVar18 = vmovdqa64_avx512f(local_180);
    auVar19 = vmovdqa64_avx512f(local_140);
    auVar20 = vmovdqa64_avx512f(local_100);
    auVar21 = vmovdqa64_avx512f(local_c0);
    auVar22 = vmovdqa64_avx512f(local_940);
    auVar23 = vmovdqa64_avx512f(local_900);
    auVar24 = vmovdqa64_avx512f(local_8c0);
    auVar25 = vmovdqa64_avx512f(local_880);
    auVar26 = vmovdqa64_avx512f(local_840);
    auVar27 = vmovdqa64_avx512f(local_800);
    auVar28 = vmovdqa64_avx512f(local_7c0);
    auVar29 = vmovdqa64_avx512f(local_780);
    auVar30 = vmovdqa64_avx512f(local_740);
    auVar31 = vmovdqa64_avx512f(local_700);
    auVar32 = vmovdqa64_avx512f(local_6c0);
    auVar33 = vmovdqa64_avx512f(local_680);
    auVar34 = vmovdqa64_avx512f(local_640);
    auVar35 = vmovdqa64_avx512f(local_600);
    auVar36 = vmovdqa64_avx512f(local_5c0);
    lVar7 = 0;
    auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar38 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + lVar7));
      auVar4._8_8_ = local_480._8_8_;
      auVar4._0_8_ = local_480._0_8_;
      auVar4._16_8_ = local_480._16_8_;
      auVar4._24_8_ = local_480._24_8_;
      auVar4._32_8_ = local_480._32_8_;
      auVar4._40_8_ = local_480._40_8_;
      auVar4._48_8_ = local_480._48_8_;
      auVar4._56_8_ = local_480._56_8_;
      auVar39 = vpandq_avx512f(auVar38,auVar4);
      auVar40 = vpsrld_avx512f(auVar39,0x10);
      auVar9 = vpaddd_avx512f(auVar40,auVar9);
      auVar39 = vpandd_avx512f(auVar39,auVar37);
      auVar9 = vpaddd_avx512f(auVar9,auVar39);
      auVar3._8_8_ = uStack_438;
      auVar3._0_8_ = local_440;
      auVar3._16_8_ = uStack_430;
      auVar3._24_8_ = uStack_428;
      auVar3._32_8_ = uStack_420;
      auVar3._40_8_ = uStack_418;
      auVar3._48_8_ = uStack_410;
      auVar3._56_8_ = uStack_408;
      auVar39 = vpandq_avx512f(auVar38,auVar3);
      auVar40 = vpsrld_avx512f(auVar39,1);
      auVar39 = vpsrld_avx512f(auVar39,0x11);
      auVar22 = vpaddd_avx512f(auVar39,auVar22);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar22 = vpaddd_avx512f(auVar22,auVar39);
      auVar40._8_8_ = uStack_3f8;
      auVar40._0_8_ = local_400;
      auVar40._16_8_ = uStack_3f0;
      auVar40._24_8_ = uStack_3e8;
      auVar40._32_8_ = uStack_3e0;
      auVar40._40_8_ = uStack_3d8;
      auVar40._48_8_ = uStack_3d0;
      auVar40._56_8_ = uStack_3c8;
      auVar39 = vpandq_avx512f(auVar38,auVar40);
      auVar40 = vpsrld_avx512f(auVar39,2);
      auVar39 = vpsrld_avx512f(auVar39,0x12);
      auVar23 = vpaddd_avx512f(auVar39,auVar23);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar23 = vpaddd_avx512f(auVar23,auVar39);
      auVar39._8_8_ = uStack_3b8;
      auVar39._0_8_ = local_3c0;
      auVar39._16_8_ = uStack_3b0;
      auVar39._24_8_ = uStack_3a8;
      auVar39._32_8_ = uStack_3a0;
      auVar39._40_8_ = uStack_398;
      auVar39._48_8_ = uStack_390;
      auVar39._56_8_ = uStack_388;
      auVar39 = vpandq_avx512f(auVar38,auVar39);
      auVar40 = vpsrld_avx512f(auVar39,3);
      auVar39 = vpsrld_avx512f(auVar39,0x13);
      auVar24 = vpaddd_avx512f(auVar39,auVar24);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar24 = vpaddd_avx512f(auVar24,auVar39);
      auVar39 = vpandq_avx512f(auVar10,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,4);
      auVar39 = vpsrld_avx512f(auVar39,0x14);
      auVar25 = vpaddd_avx512f(auVar39,auVar25);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar25 = vpaddd_avx512f(auVar25,auVar39);
      auVar39 = vpandq_avx512f(auVar11,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,5);
      auVar39 = vpsrld_avx512f(auVar39,0x15);
      auVar26 = vpaddd_avx512f(auVar39,auVar26);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar26 = vpaddd_avx512f(auVar26,auVar39);
      auVar39 = vpandq_avx512f(auVar12,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,6);
      auVar39 = vpsrld_avx512f(auVar39,0x16);
      auVar27 = vpaddd_avx512f(auVar39,auVar27);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar27 = vpaddd_avx512f(auVar27,auVar39);
      auVar39 = vpandq_avx512f(auVar13,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,7);
      auVar39 = vpsrld_avx512f(auVar39,0x17);
      auVar28 = vpaddd_avx512f(auVar39,auVar28);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar28 = vpaddd_avx512f(auVar28,auVar39);
      auVar39 = vpandq_avx512f(auVar14,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,8);
      auVar39 = vpsrld_avx512f(auVar39,0x18);
      auVar29 = vpaddd_avx512f(auVar39,auVar29);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar29 = vpaddd_avx512f(auVar29,auVar39);
      auVar39 = vpandq_avx512f(auVar15,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,9);
      auVar39 = vpsrld_avx512f(auVar39,0x19);
      auVar30 = vpaddd_avx512f(auVar39,auVar30);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar30 = vpaddd_avx512f(auVar30,auVar39);
      auVar39 = vpandq_avx512f(auVar16,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,10);
      auVar39 = vpsrld_avx512f(auVar39,0x1a);
      auVar31 = vpaddd_avx512f(auVar39,auVar31);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar31 = vpaddd_avx512f(auVar31,auVar39);
      auVar39 = vpandq_avx512f(auVar17,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,0xb);
      auVar39 = vpsrld_avx512f(auVar39,0x1b);
      auVar32 = vpaddd_avx512f(auVar39,auVar32);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar32 = vpaddd_avx512f(auVar32,auVar39);
      auVar39 = vpandq_avx512f(auVar18,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,0xc);
      auVar39 = vpsrld_avx512f(auVar39,0x1c);
      auVar33 = vpaddd_avx512f(auVar39,auVar33);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar33 = vpaddd_avx512f(auVar33,auVar39);
      auVar39 = vpandq_avx512f(auVar19,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,0xd);
      auVar39 = vpsrld_avx512f(auVar39,0x1d);
      auVar34 = vpaddd_avx512f(auVar39,auVar34);
      auVar39 = vpandd_avx512f(auVar40,auVar37);
      auVar34 = vpaddd_avx512f(auVar34,auVar39);
      auVar39 = vpandq_avx512f(auVar20,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,0x1e);
      auVar35 = vpaddd_avx512f(auVar40,auVar35);
      auVar39 = vpsrld_avx512f(auVar39,0xe);
      auVar39 = vpandd_avx512f(auVar39,auVar37);
      auVar35 = vpaddd_avx512f(auVar35,auVar39);
      auVar39 = vpandq_avx512f(auVar21,auVar38);
      auVar40 = vpsrld_avx512f(auVar39,0x1f);
      auVar36 = vpaddd_avx512f(auVar40,auVar36);
      auVar39 = vpsrld_avx512f(auVar39,0xf);
      auVar39 = vpandd_avx512f(auVar39,auVar37);
      auVar36 = vpaddd_avx512f(auVar36,auVar39);
      lVar7 = lVar7 + 0x40;
    } while ((ulong)(len >> 5) << 6 != lVar7);
    local_940 = vmovdqa64_avx512f(auVar22);
    local_900 = vmovdqa64_avx512f(auVar23);
    local_8c0 = vmovdqa64_avx512f(auVar24);
    local_880 = vmovdqa64_avx512f(auVar25);
    local_840 = vmovdqa64_avx512f(auVar26);
    local_800 = vmovdqa64_avx512f(auVar27);
    local_7c0 = vmovdqa64_avx512f(auVar28);
    local_780 = vmovdqa64_avx512f(auVar29);
    local_740 = vmovdqa64_avx512f(auVar30);
    local_700 = vmovdqa64_avx512f(auVar31);
    local_6c0 = vmovdqa64_avx512f(auVar32);
    local_680 = vmovdqa64_avx512f(auVar33);
    local_640 = vmovdqa64_avx512f(auVar34);
    local_600 = vmovdqa64_avx512f(auVar35);
    local_5c0 = vmovdqa64_avx512f(auVar36);
  }
  local_980 = vmovdqa64_avx512f(auVar9);
  uVar5 = len & 0xffffffe0;
  if (uVar5 != len) {
    auVar9 = vmovdqa64_avx512f(local_9c0);
    auVar10 = vpmovsxbd_avx512f(_DAT_0010f080);
    auVar11 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar12 = vpbroadcastd_avx512f();
      auVar12 = vpsrlvd_avx512f(auVar12,auVar10);
      auVar12 = vpandd_avx512f(auVar12,auVar11);
      auVar9 = vpaddd_avx512f(auVar12,auVar9);
      uVar5 = uVar5 + 1;
    } while (uVar5 < len);
    local_9c0 = vmovdqa64_avx512f(auVar9);
  }
  lVar7 = 0;
  do {
    auVar9 = vpaddd_avx512f(ZEXT464(*(uint *)(local_9c0 + lVar7 * 4)),*__s);
    auVar8 = vextracti64x4_avx512f(auVar9,1);
    auVar9 = vpaddd_avx512f(auVar9,ZEXT3264(auVar8));
    auVar1 = vpaddd_avx(auVar9._0_16_,auVar9._16_16_);
    auVar2 = vpshufd_avx(auVar1,0xee);
    auVar1 = vpaddd_avx(auVar1,auVar2);
    auVar2 = vpshufd_avx(auVar1,0x55);
    auVar1 = vpaddd_avx(auVar1,auVar2);
    *(int *)(local_9c0 + lVar7 * 4) = auVar1._0_4_;
    lVar7 = lVar7 + 1;
    __s = __s + 1;
  } while (lVar7 != 0x10);
  *(undefined8 *)flags = local_9c0._0_8_;
  *(undefined8 *)(flags + 2) = local_9c0._8_8_;
  *(undefined8 *)(flags + 4) = local_9c0._16_8_;
  *(undefined8 *)(flags + 6) = local_9c0._24_8_;
  *(undefined8 *)(flags + 8) = local_9c0._32_8_;
  *(undefined8 *)(flags + 10) = local_9c0._40_8_;
  *(undefined8 *)(flags + 0xc) = local_9c0._48_8_;
  *(undefined8 *)(flags + 0xe) = local_9c0._56_8_;
  return 0;
}

Assistant:

int pospopcnt_u16_avx512(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i masks[16];
    __m512i counters[16];
    const __m512i one_mask = _mm512_set1_epi32(1);
    for (int i = 0; i < 16; ++i) {
        masks[i]    = _mm512_set1_epi16(1 << i);
        counters[i] = _mm512_set1_epi32(0);
    }
    uint32_t out_counters[16] = {0};

    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

#define UPDATE(pos) {                                            \
    __m512i a   = _mm512_and_epi32(_mm512_loadu_si512(data_vectors+i), masks[pos]); \
    __m512i d   = _mm512_add_epi32(_mm512_and_epi32(_mm512_srli_epi32(a, pos), one_mask), _mm512_srli_epi32(a, pos+16)); \
    counters[pos] = _mm512_add_epi32(counters[pos], d);          \
}
#define BLOCK {                                 \
    UPDATE(0)  UPDATE(1)  UPDATE(2)  UPDATE(3)  \
    UPDATE(4)  UPDATE(5)  UPDATE(6)  UPDATE(7)  \
    UPDATE(8)  UPDATE(9)  UPDATE(10) UPDATE(11) \
    UPDATE(12) UPDATE(13) UPDATE(14) UPDATE(15) \
}

    for (int i = 0; i < n_cycles; ++i) {
        BLOCK
    }

#undef BLOCK
#undef UPDATE

    // residual
    for (int i = n_cycles*32; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) {
        uint32_t* v = (uint32_t*)(&counters[i]);
        for (int j = 0; j < 16; ++j)
            out_counters[i] += v[j];
    }
 
    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

    return 0;
}